

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_read_filter_row_sub(png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  ulong uVar1;
  uint uVar2;
  png_bytep local_40;
  png_bytep rp;
  uint bpp;
  size_t istop;
  size_t i;
  png_const_bytep prev_row_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  uVar1 = row_info->rowbytes;
  uVar2 = (int)(row_info->pixel_depth + 7) >> 3;
  local_40 = row + uVar2;
  for (istop = (size_t)uVar2; istop < uVar1; istop = istop + 1) {
    *local_40 = *local_40 + local_40[-(ulong)uVar2];
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

static void
png_read_filter_row_sub(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   size_t i;
   size_t istop = row_info->rowbytes;
   unsigned int bpp = (row_info->pixel_depth + 7) >> 3;
   png_bytep rp = row + bpp;

   PNG_UNUSED(prev_row)

   for (i = bpp; i < istop; i++)
   {
      *rp = (png_byte)(((int)(*rp) + (int)(*(rp-bpp))) & 0xff);
      rp++;
   }
}